

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

aiMesh * __thiscall
Assimp::FBX::FBXConverter::SetupEmptyMesh(FBXConverter *this,Geometry *mesh,aiNode *nd)

{
  pointer *pppaVar1;
  pointer *ppuVar2;
  uint uVar3;
  iterator __position;
  iterator __position_00;
  pointer pcVar4;
  int iVar5;
  aiMesh *paVar6;
  mapped_type *this_00;
  ulong __n;
  aiMesh *out_mesh;
  string name;
  aiMesh *local_78;
  Geometry *local_70;
  ulong local_68;
  uint local_50;
  undefined4 uStack_4c;
  undefined1 local_40 [16];
  
  paVar6 = (aiMesh *)operator_new(0x520);
  paVar6->mPrimitiveTypes = 0;
  paVar6->mNumVertices = 0;
  paVar6->mNumFaces = 0;
  memset(&paVar6->mVertices,0,0xcc);
  paVar6->mBones = (aiBone **)0x0;
  paVar6->mMaterialIndex = 0;
  (paVar6->mName).length = 0;
  (paVar6->mName).data[0] = '\0';
  memset((paVar6->mName).data + 1,0x1b,0x3ff);
  paVar6->mNumAnimMeshes = 0;
  paVar6->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar6->mMethod = 0;
  (paVar6->mAABB).mMin.x = 0.0;
  (paVar6->mAABB).mMin.y = 0.0;
  (paVar6->mAABB).mMin.z = 0.0;
  (paVar6->mAABB).mMax.x = 0.0;
  (paVar6->mAABB).mMax.y = 0.0;
  (paVar6->mAABB).mMax.z = 0.0;
  memset(paVar6->mColors,0,0xa0);
  __position._M_current =
       (this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_78 = paVar6;
  if (__position._M_current ==
      (this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
              ((vector<aiMesh*,std::allocator<aiMesh*>> *)&this->meshes,__position,&local_78);
  }
  else {
    *__position._M_current = paVar6;
    pppaVar1 = &(this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppaVar1 = *pppaVar1 + 1;
  }
  local_70 = mesh;
  this_00 = std::
            map<const_Assimp::FBX::Geometry_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<const_Assimp::FBX::Geometry_*>,_std::allocator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
            ::operator[](&this->meshes_converted,&local_70);
  local_50 = (int)((ulong)((long)(this->meshes).
                                 super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(this->meshes).
                                super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 3) - 1;
  __position_00._M_current =
       (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (this_00,__position_00,&local_50);
  }
  else {
    *__position_00._M_current = local_50;
    ppuVar2 = &(this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar2 = *ppuVar2 + 1;
  }
  pcVar4 = (mesh->super_Object).name._M_dataplus._M_p;
  local_70 = (key_type)&stack0xffffffffffffffa0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar4,pcVar4 + (mesh->super_Object).name._M_string_length);
  std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_70);
  iVar5 = std::__cxx11::string::compare((char *)&local_50);
  if ((undefined1 *)CONCAT44(uStack_4c,local_50) != local_40) {
    operator_delete((undefined1 *)CONCAT44(uStack_4c,local_50));
  }
  if (iVar5 == 0) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_70);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
    if ((undefined1 *)CONCAT44(uStack_4c,local_50) != local_40) {
      operator_delete((undefined1 *)CONCAT44(uStack_4c,local_50));
    }
  }
  paVar6 = local_78;
  if (local_68 == 0) {
    if ((aiNode *)&local_78->mName == nd) goto LAB_00171e69;
    uVar3 = (nd->mName).length;
    __n = (ulong)uVar3;
    (local_78->mName).length = uVar3;
    memcpy((local_78->mName).data,(nd->mName).data,__n);
  }
  else {
    if (0x3ff < local_68) goto LAB_00171e69;
    (local_78->mName).length = (ai_uint32)local_68;
    memcpy((local_78->mName).data,local_70,local_68);
    __n = local_68;
  }
  (paVar6->mName).data[__n] = '\0';
LAB_00171e69:
  paVar6 = local_78;
  if (local_70 != (key_type)&stack0xffffffffffffffa0) {
    operator_delete(local_70);
  }
  return paVar6;
}

Assistant:

aiMesh* FBXConverter::SetupEmptyMesh(const Geometry& mesh, aiNode& nd)
        {
            aiMesh* const out_mesh = new aiMesh();
            meshes.push_back(out_mesh);
            meshes_converted[&mesh].push_back(static_cast<unsigned int>(meshes.size() - 1));

            // set name
            std::string name = mesh.Name();
            if (name.substr(0, 10) == "Geometry::") {
                name = name.substr(10);
            }

            if (name.length()) {
                out_mesh->mName.Set(name);
            }
            else
            {
                out_mesh->mName = nd.mName;
            }

            return out_mesh;
        }